

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_taproot.cpp
# Opt level: O3

bool __thiscall cfd::core::TapBranch::IsFindTapScript(TapBranch *this,Script *tapscript)

{
  pointer pTVar1;
  bool bVar2;
  TapBranch *branch;
  pointer this_00;
  
  if ((this->has_leaf_ == true) && (bVar2 = Script::Equals(&this->script_,tapscript), bVar2)) {
    return true;
  }
  this_00 = (this->branch_list_).
            super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>._M_impl.
            super__Vector_impl_data._M_start;
  pTVar1 = (this->branch_list_).
           super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (this_00 == pTVar1) {
    bVar2 = false;
  }
  else {
    do {
      bVar2 = IsFindTapScript(this_00,tapscript);
      if (bVar2) {
        return bVar2;
      }
      this_00 = this_00 + 1;
    } while (this_00 != pTVar1);
  }
  return bVar2;
}

Assistant:

bool TapBranch::IsFindTapScript(const Script& tapscript) const {
  if (has_leaf_ && script_.Equals(tapscript)) return true;

  for (const auto& branch : branch_list_) {
    if (branch.IsFindTapScript(tapscript)) return true;
  }
  return false;
}